

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::ExpandRuleVariable
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *variable,
          RuleVariables *replaceValues)

{
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  TargetType targetType;
  ulong uVar4;
  string *psVar5;
  cmState *this_00;
  long lVar6;
  char *pcVar7;
  allocator local_459;
  string local_458;
  string local_438;
  allocator local_411;
  string local_410;
  string local_3f0;
  undefined1 local_3ca;
  allocator local_3c9;
  undefined1 local_3c8 [8];
  string replace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  allocator local_339;
  string local_338;
  allocator local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  allocator local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  string arg1;
  char *compilerOptionSysroot;
  char *compilerSysroot;
  char *compilerOptionExternalToolchain;
  char *compilerExternalToolchain;
  char *compilerOptionTarget;
  char *compilerTarget;
  char *compilerArg1;
  undefined1 local_118 [8];
  string actualReplace;
  char *lang;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  iterator i;
  undefined1 local_d8 [4];
  int pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  allocator local_b8;
  allocator local_b7;
  allocator local_b6;
  allocator local_b5;
  int local_b4;
  long local_b0;
  size_type pos_1;
  string local_a0 [8];
  string targetBase;
  string local_78 [32];
  ulong local_58;
  size_type sz;
  allocator local_48;
  allocator local_47;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [20];
  allocator local_29;
  RuleVariables *local_28;
  RuleVariables *replaceValues_local;
  string *variable_local;
  cmLocalGenerator *this_local;
  string *targetQuoted;
  
  local_28 = replaceValues;
  replaceValues_local = (RuleVariables *)variable;
  variable_local = (string *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  if ((replaceValues->LinkFlags == (char *)0x0) ||
     (bVar2 = std::operator==(variable,"LINK_FLAGS"), !bVar2)) {
    if ((local_28->Flags == (char *)0x0) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )replaceValues_local,"FLAGS"), !bVar2)) {
      if ((local_28->Source == (char *)0x0) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)replaceValues_local,"SOURCE"), !bVar2)) {
        if ((local_28->PreprocessedSource == (char *)0x0) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)replaceValues_local,"PREPROCESSED_SOURCE"), !bVar2)) {
          if ((local_28->AssemblySource == (char *)0x0) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)replaceValues_local,"ASSEMBLY_SOURCE"), !bVar2)) {
            if ((local_28->Object == (char *)0x0) ||
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)replaceValues_local,"OBJECT"), !bVar2)) {
              if ((local_28->ObjectDir == (char *)0x0) ||
                 (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)replaceValues_local,"OBJECT_DIR"), !bVar2)) {
                if ((local_28->ObjectFileDir == (char *)0x0) ||
                   (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)replaceValues_local,"OBJECT_FILE_DIR"), !bVar2)) {
                  if ((local_28->Objects == (char *)0x0) ||
                     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)replaceValues_local,"OBJECTS"), !bVar2)) {
                    if ((local_28->ObjectsQuoted == (char *)0x0) ||
                       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)replaceValues_local,"OBJECTS_QUOTED"), !bVar2)) {
                      if ((local_28->Defines == (char *)0x0) ||
                         (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"DEFINES"), !bVar2)) {
                        if ((local_28->TargetPDB == (char *)0x0) ||
                           (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_PDB"), !bVar2)) {
                          if ((local_28->TargetCompilePDB == (char *)0x0) ||
                             (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_COMPILE_PDB"),
                             !bVar2)) {
                            if ((local_28->DependencyFile == (char *)0x0) ||
                               (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"DEP_FILE"), !bVar2)) {
                              if (local_28->Target != (char *)0x0) {
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_QUOTED");
                                if (bVar2) {
                                  sz._6_1_ = 0;
                                  pcVar7 = local_28->Target;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,pcVar7,
                                             (allocator *)((long)&sz + 5));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)((long)&sz + 5));
                                  uVar4 = std::__cxx11::string::empty();
                                  if ((uVar4 & 1) != 0) {
                                    return __return_storage_ptr__;
                                  }
                                  pcVar7 = (char *)std::__cxx11::string::operator[]
                                                             ((ulong)__return_storage_ptr__);
                                  if (*pcVar7 == '\"') {
                                    return __return_storage_ptr__;
                                  }
                                  std::__cxx11::string::operator=
                                            ((string *)__return_storage_ptr__,'\"');
                                  std::__cxx11::string::operator+=
                                            ((string *)__return_storage_ptr__,local_28->Target);
                                  std::__cxx11::string::operator+=
                                            ((string *)__return_storage_ptr__,'\"');
                                  return __return_storage_ptr__;
                                }
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_UNQUOTED");
                                if (bVar2) {
                                  sz._4_1_ = 0;
                                  pcVar7 = local_28->Target;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,pcVar7,
                                             (allocator *)((long)&sz + 3));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)((long)&sz + 3));
                                  local_58 = std::__cxx11::string::size();
                                  if (local_58 < 3) {
                                    return __return_storage_ptr__;
                                  }
                                  pcVar7 = (char *)std::__cxx11::string::operator[]
                                                             ((ulong)__return_storage_ptr__);
                                  if (*pcVar7 != '\"') {
                                    return __return_storage_ptr__;
                                  }
                                  pcVar7 = (char *)std::__cxx11::string::operator[]
                                                             ((ulong)__return_storage_ptr__);
                                  if (*pcVar7 != '\"') {
                                    return __return_storage_ptr__;
                                  }
                                  std::__cxx11::string::substr
                                            ((ulong)local_78,(ulong)__return_storage_ptr__);
                                  std::__cxx11::string::operator=
                                            ((string *)__return_storage_ptr__,local_78);
                                  std::__cxx11::string::~string(local_78);
                                  return __return_storage_ptr__;
                                }
                                if ((local_28->LanguageCompileFlags != (char *)0x0) &&
                                   (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"LANGUAGE_COMPILE_FLAGS"),
                                   bVar2)) {
                                  pcVar7 = local_28->LanguageCompileFlags;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,pcVar7,
                                             (allocator *)(targetBase.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             (targetBase.field_2._M_local_buf + 0xf));
                                  return __return_storage_ptr__;
                                }
                                if ((local_28->Target != (char *)0x0) &&
                                   (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET"), bVar2)) {
                                  pcVar7 = local_28->Target;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,pcVar7,
                                             (allocator *)(targetBase.field_2._M_local_buf + 0xe));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             (targetBase.field_2._M_local_buf + 0xe));
                                  return __return_storage_ptr__;
                                }
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_IMPLIB");
                                if (bVar2) {
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,
                                             (string *)&this->TargetImplib);
                                  return __return_storage_ptr__;
                                }
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_VERSION_MAJOR");
                                if (bVar2) {
                                  if (local_28->TargetVersionMajor != (char *)0x0) {
                                    pcVar7 = local_28->TargetVersionMajor;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)__return_storage_ptr__,pcVar7,
                                               (allocator *)(targetBase.field_2._M_local_buf + 0xd))
                                    ;
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               (targetBase.field_2._M_local_buf + 0xd));
                                    return __return_storage_ptr__;
                                  }
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,"0",
                                             (allocator *)(targetBase.field_2._M_local_buf + 0xc));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             (targetBase.field_2._M_local_buf + 0xc));
                                  return __return_storage_ptr__;
                                }
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_VERSION_MINOR");
                                if (bVar2) {
                                  if (local_28->TargetVersionMinor != (char *)0x0) {
                                    pcVar7 = local_28->TargetVersionMinor;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)__return_storage_ptr__,pcVar7,
                                               (allocator *)(targetBase.field_2._M_local_buf + 0xb))
                                    ;
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               (targetBase.field_2._M_local_buf + 0xb));
                                    return __return_storage_ptr__;
                                  }
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,"0",
                                             (allocator *)(targetBase.field_2._M_local_buf + 10));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             (targetBase.field_2._M_local_buf + 10));
                                  return __return_storage_ptr__;
                                }
                                if ((local_28->Target != (char *)0x0) &&
                                   (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_BASE"), bVar2)) {
                                  pcVar7 = local_28->Target;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_a0,pcVar7,(allocator *)((long)&pos_1 + 7));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)((long)&pos_1 + 7));
                                  local_b0 = std::__cxx11::string::rfind((char *)local_a0,0x8ccd6d);
                                  if (local_b0 == -1) {
                                    std::__cxx11::string::string
                                              ((string *)__return_storage_ptr__,local_a0);
                                  }
                                  else {
                                    std::__cxx11::string::substr
                                              ((ulong)__return_storage_ptr__,(ulong)local_a0);
                                  }
                                  local_b4 = 1;
                                  std::__cxx11::string::~string(local_a0);
                                  return __return_storage_ptr__;
                                }
                              }
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_SONAME");
                              if (((bVar2) ||
                                  (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SONAME_FLAG"), bVar2)) ||
                                 (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_INSTALLNAME_DIR"),
                                 bVar2)) {
                                if (local_28->TargetSOName != (char *)0x0) {
                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_SONAME");
                                  if (bVar2) {
                                    pcVar7 = local_28->TargetSOName;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)__return_storage_ptr__,pcVar7,&local_b5);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_b5);
                                    return __return_storage_ptr__;
                                  }
                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SONAME_FLAG");
                                  if ((bVar2) && (local_28->SONameFlag != (char *)0x0)) {
                                    pcVar7 = local_28->SONameFlag;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)__return_storage_ptr__,pcVar7,&local_b6);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_b6);
                                    return __return_storage_ptr__;
                                  }
                                  if ((local_28->TargetInstallNameDir != (char *)0x0) &&
                                     (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_INSTALLNAME_DIR"),
                                     bVar2)) {
                                    pcVar7 = local_28->TargetInstallNameDir;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)__return_storage_ptr__,pcVar7,&local_b7);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_b7);
                                    return __return_storage_ptr__;
                                  }
                                }
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)__return_storage_ptr__,"",&local_b8);
                                std::allocator<char>::~allocator((allocator<char> *)&local_b8);
                              }
                              else if ((local_28->LinkLibraries == (char *)0x0) ||
                                      (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"LINK_LIBRARIES"), !bVar2))
                              {
                                if ((local_28->Language == (char *)0x0) ||
                                   (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"LANGUAGE"), !bVar2)) {
                                  if (local_28->CMTarget != (cmTarget *)0x0) {
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_NAME");
                                    if (bVar2) {
                                      psVar5 = cmTarget::GetName_abi_cxx11_(local_28->CMTarget);
                                      std::__cxx11::string::string
                                                ((string *)__return_storage_ptr__,(string *)psVar5);
                                      return __return_storage_ptr__;
                                    }
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_TYPE");
                                    if (bVar2) {
                                      targetType = cmTarget::GetType(local_28->CMTarget);
                                      pcVar7 = cmTarget::GetTargetTypeName(targetType);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)__return_storage_ptr__,pcVar7,
                                                 (allocator *)
                                                 ((long)&enabledLanguages.
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 + 5));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 ((long)&enabledLanguages.
                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 + 5));
                                      return __return_storage_ptr__;
                                    }
                                  }
                                  if ((local_28->Output == (char *)0x0) ||
                                     (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"OUTPUT"), !bVar2)) {
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"CMAKE_COMMAND");
                                    if (bVar2) {
                                      psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                                      cmOutputConverter::Convert
                                                (__return_storage_ptr__,
                                                 &this->super_cmOutputConverter,psVar5,FULL,SHELL);
                                    }
                                    else {
                                      this_00 = GetState(this);
                                      cmState::GetEnabledLanguages_abi_cxx11_
                                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d8,this_00);
                                      for (i._M_current._4_4_ = 0;
                                          ruleReplaceVars[i._M_current._4_4_] != (char *)0x0;
                                          i._M_current._4_4_ = i._M_current._4_4_ + 1) {
                                        local_e8._M_current =
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)std::
                                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d8);
                                        while( true ) {
                                          lang = (char *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_d8);
                                          bVar2 = __gnu_cxx::operator!=
                                                            (&local_e8,
                                                             (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&lang);
                                          if (!bVar2) break;
                                          __gnu_cxx::
                                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ::operator->(&local_e8);
                                          actualReplace.field_2._8_8_ =
                                               std::__cxx11::string::c_str();
                                          pcVar7 = ruleReplaceVars[i._M_current._4_4_];
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    ((string *)local_118,pcVar7,
                                                     (allocator *)((long)&compilerArg1 + 7));
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)((long)&compilerArg1 + 7));
                                          compilerTarget = (char *)0x0;
                                          compilerOptionTarget = (char *)0x0;
                                          compilerExternalToolchain = (char *)0x0;
                                          compilerOptionExternalToolchain = (char *)0x0;
                                          compilerSysroot = (char *)0x0;
                                          compilerOptionSysroot = (char *)0x0;
                                          arg1.field_2._8_8_ = 0;
                                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_118,"CMAKE_${LANG}_COMPILER");
                                          if (bVar2) {
                                            std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_178,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_118,"_ARG1");
                                            cmsys::SystemTools::ReplaceString
                                                      ((string *)local_178,"${LANG}",
                                                       (char *)actualReplace.field_2._8_8_);
                                            compilerTarget =
                                                 cmMakefile::GetDefinition
                                                           (this->Makefile,(string *)local_178);
                                            pcVar1 = this->Makefile;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_1d8,"CMAKE_",&local_1d9);
                                            std::operator+(&local_1b8,&local_1d8,
                                                           (char *)actualReplace.field_2._8_8_);
                                            std::operator+(&local_198,&local_1b8,"_COMPILER_TARGET")
                                            ;
                                            compilerOptionTarget =
                                                 cmMakefile::GetDefinition(pcVar1,&local_198);
                                            std::__cxx11::string::~string((string *)&local_198);
                                            std::__cxx11::string::~string((string *)&local_1b8);
                                            std::__cxx11::string::~string((string *)&local_1d8);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_1d9);
                                            pcVar1 = this->Makefile;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_240,"CMAKE_",&local_241);
                                            std::operator+(&local_220,&local_240,
                                                           (char *)actualReplace.field_2._8_8_);
                                            std::operator+(&local_200,&local_220,
                                                           "_COMPILE_OPTIONS_TARGET");
                                            compilerExternalToolchain =
                                                 cmMakefile::GetDefinition(pcVar1,&local_200);
                                            std::__cxx11::string::~string((string *)&local_200);
                                            std::__cxx11::string::~string((string *)&local_220);
                                            std::__cxx11::string::~string((string *)&local_240);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_241);
                                            pcVar1 = this->Makefile;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_2a8,"CMAKE_",&local_2a9);
                                            std::operator+(&local_288,&local_2a8,
                                                           (char *)actualReplace.field_2._8_8_);
                                            std::operator+(&local_268,&local_288,
                                                           "_COMPILER_EXTERNAL_TOOLCHAIN");
                                            compilerOptionExternalToolchain =
                                                 cmMakefile::GetDefinition(pcVar1,&local_268);
                                            std::__cxx11::string::~string((string *)&local_268);
                                            std::__cxx11::string::~string((string *)&local_288);
                                            std::__cxx11::string::~string((string *)&local_2a8);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_2a9);
                                            pcVar1 = this->Makefile;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_310,"CMAKE_",&local_311);
                                            std::operator+(&local_2f0,&local_310,
                                                           (char *)actualReplace.field_2._8_8_);
                                            std::operator+(&local_2d0,&local_2f0,
                                                           "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
                                            compilerSysroot =
                                                 cmMakefile::GetDefinition(pcVar1,&local_2d0);
                                            std::__cxx11::string::~string((string *)&local_2d0);
                                            std::__cxx11::string::~string((string *)&local_2f0);
                                            std::__cxx11::string::~string((string *)&local_310);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_311);
                                            pcVar1 = this->Makefile;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_338,"CMAKE_SYSROOT",
                                                       &local_339);
                                            compilerOptionSysroot =
                                                 cmMakefile::GetDefinition(pcVar1,&local_338);
                                            std::__cxx11::string::~string((string *)&local_338);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_339);
                                            pcVar1 = this->Makefile;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_3a0,"CMAKE_",
                                                       (allocator *)
                                                       (replace.field_2._M_local_buf + 0xf));
                                            std::operator+(&local_380,&local_3a0,
                                                           (char *)actualReplace.field_2._8_8_);
                                            std::operator+(&local_360,&local_380,
                                                           "_COMPILE_OPTIONS_SYSROOT");
                                            arg1.field_2._8_8_ =
                                                 cmMakefile::GetDefinition(pcVar1,&local_360);
                                            std::__cxx11::string::~string((string *)&local_360);
                                            std::__cxx11::string::~string((string *)&local_380);
                                            std::__cxx11::string::~string((string *)&local_3a0);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)
                                                       (replace.field_2._M_local_buf + 0xf));
                                            std::__cxx11::string::~string((string *)local_178);
                                          }
                                          lVar6 = std::__cxx11::string::find(local_118,0x8c089f);
                                          if (lVar6 != -1) {
                                            cmsys::SystemTools::ReplaceString
                                                      ((string *)local_118,"${LANG}",
                                                       (char *)actualReplace.field_2._8_8_);
                                          }
                                          _Var3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_118,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local);
                                          if (_Var3) {
                                            pcVar7 = cmMakefile::GetSafeDefinition
                                                               (this->Makefile,
                                                                (string *)replaceValues_local);
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)local_3c8,pcVar7,&local_3c9);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_3c9);
                                            lVar6 = std::__cxx11::string::find
                                                              ((char *)replaceValues_local,0x8c8fc4)
                                            ;
                                            if (lVar6 == -1) {
                                              local_3ca = 0;
                                              cmOutputConverter::ConvertToOutputForExisting
                                                        (__return_storage_ptr__,
                                                         &this->super_cmOutputConverter,
                                                         (string *)local_3c8,START_OUTPUT,SHELL);
                                              if (compilerTarget != (char *)0x0) {
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__," ");
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__,
                                                           compilerTarget);
                                              }
                                              if ((compilerOptionTarget != (char *)0x0) &&
                                                 (compilerExternalToolchain != (char *)0x0)) {
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__," ");
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__,
                                                           compilerExternalToolchain);
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__,
                                                           compilerOptionTarget);
                                              }
                                              if ((compilerOptionExternalToolchain != (char *)0x0)
                                                 && (compilerSysroot != (char *)0x0)) {
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__," ");
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__,
                                                           compilerSysroot);
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)&local_410,
                                                           compilerOptionExternalToolchain,
                                                           &local_411);
                                                cmOutputConverter::EscapeForShell
                                                          (&local_3f0,&this->super_cmOutputConverter
                                                           ,&local_410,true,false,false);
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__,
                                                           (string *)&local_3f0);
                                                std::__cxx11::string::~string((string *)&local_3f0);
                                                std::__cxx11::string::~string((string *)&local_410);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_411);
                                              }
                                              if ((compilerOptionSysroot != (char *)0x0) &&
                                                 (arg1.field_2._8_8_ != 0)) {
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__," ");
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__,
                                                           (char *)arg1.field_2._8_8_);
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)&local_458,
                                                           compilerOptionSysroot,&local_459);
                                                cmOutputConverter::EscapeForShell
                                                          (&local_438,&this->super_cmOutputConverter
                                                           ,&local_458,true,false,false);
                                                std::__cxx11::string::operator+=
                                                          ((string *)__return_storage_ptr__,
                                                           (string *)&local_438);
                                                std::__cxx11::string::~string((string *)&local_438);
                                                std::__cxx11::string::~string((string *)&local_458);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_459);
                                              }
                                              local_3ca = 1;
                                            }
                                            else {
                                              std::__cxx11::string::string
                                                        ((string *)__return_storage_ptr__,
                                                         (string *)local_3c8);
                                            }
                                            local_b4 = 1;
                                            std::__cxx11::string::~string((string *)local_3c8);
                                          }
                                          else {
                                            local_b4 = 0;
                                          }
                                          std::__cxx11::string::~string((string *)local_118);
                                          if (local_b4 != 0) goto LAB_0049960e;
                                          __gnu_cxx::
                                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ::operator++(&local_e8);
                                        }
                                      }
                                      std::__cxx11::string::string
                                                ((string *)__return_storage_ptr__,
                                                 (string *)replaceValues_local);
                                      local_b4 = 1;
LAB_0049960e:
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_d8);
                                    }
                                  }
                                  else {
                                    pcVar7 = local_28->Output;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)__return_storage_ptr__,pcVar7,
                                               (allocator *)
                                               ((long)&enabledLanguages.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + 4));
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               ((long)&enabledLanguages.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + 4));
                                  }
                                }
                                else {
                                  pcVar7 = local_28->Language;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)__return_storage_ptr__,pcVar7,
                                             (allocator *)
                                             ((long)&enabledLanguages.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 6));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             ((long)&enabledLanguages.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 6));
                                }
                              }
                              else {
                                pcVar7 = local_28->LinkLibraries;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)__return_storage_ptr__,pcVar7,
                                           (allocator *)
                                           ((long)&enabledLanguages.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 7));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)
                                           ((long)&enabledLanguages.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 7));
                              }
                            }
                            else {
                              pcVar7 = local_28->DependencyFile;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)__return_storage_ptr__,pcVar7,
                                         (allocator *)((long)&sz + 7));
                              std::allocator<char>::~allocator((allocator<char> *)((long)&sz + 7));
                            }
                          }
                          else {
                            pcVar7 = local_28->TargetCompilePDB;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)__return_storage_ptr__,pcVar7,&local_48);
                            std::allocator<char>::~allocator((allocator<char> *)&local_48);
                          }
                        }
                        else {
                          pcVar7 = local_28->TargetPDB;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)__return_storage_ptr__,pcVar7,&local_47);
                          std::allocator<char>::~allocator((allocator<char> *)&local_47);
                        }
                      }
                      else {
                        pcVar7 = local_28->Defines;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)__return_storage_ptr__,pcVar7,&local_46);
                        std::allocator<char>::~allocator((allocator<char> *)&local_46);
                      }
                    }
                    else {
                      pcVar7 = local_28->ObjectsQuoted;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)__return_storage_ptr__,pcVar7,&local_45);
                      std::allocator<char>::~allocator((allocator<char> *)&local_45);
                    }
                  }
                  else {
                    pcVar7 = local_28->Objects;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_44);
                    std::allocator<char>::~allocator((allocator<char> *)&local_44);
                  }
                }
                else {
                  pcVar7 = local_28->ObjectFileDir;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_43);
                  std::allocator<char>::~allocator((allocator<char> *)&local_43);
                }
              }
              else {
                pcVar7 = local_28->ObjectDir;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_42);
                std::allocator<char>::~allocator((allocator<char> *)&local_42);
              }
            }
            else {
              pcVar7 = local_28->Object;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_41);
              std::allocator<char>::~allocator((allocator<char> *)&local_41);
            }
          }
          else {
            pcVar7 = local_28->AssemblySource;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_40);
            std::allocator<char>::~allocator((allocator<char> *)&local_40);
          }
        }
        else {
          pcVar7 = local_28->PreprocessedSource;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_3f);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f);
        }
      }
      else {
        pcVar7 = local_28->Source;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_3e);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e);
      }
    }
    else {
      pcVar7 = local_28->Flags;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,local_3d);
      std::allocator<char>::~allocator((allocator<char> *)local_3d);
    }
  }
  else {
    pcVar7 = local_28->LinkFlags;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalGenerator::ExpandRuleVariable(std::string const& variable,
                                     const RuleVariables& replaceValues)
{
  if(replaceValues.LinkFlags)
    {
    if(variable == "LINK_FLAGS")
      {
      return replaceValues.LinkFlags;
      }
    }
  if(replaceValues.Flags)
    {
    if(variable == "FLAGS")
      {
      return replaceValues.Flags;
      }
    }

  if(replaceValues.Source)
    {
    if(variable == "SOURCE")
      {
      return replaceValues.Source;
      }
    }
  if(replaceValues.PreprocessedSource)
    {
    if(variable == "PREPROCESSED_SOURCE")
      {
      return replaceValues.PreprocessedSource;
      }
    }
  if(replaceValues.AssemblySource)
    {
    if(variable == "ASSEMBLY_SOURCE")
      {
      return replaceValues.AssemblySource;
      }
    }
  if(replaceValues.Object)
    {
    if(variable == "OBJECT")
      {
      return replaceValues.Object;
      }
    }
  if(replaceValues.ObjectDir)
    {
    if(variable == "OBJECT_DIR")
      {
      return replaceValues.ObjectDir;
      }
    }
  if(replaceValues.ObjectFileDir)
    {
    if(variable == "OBJECT_FILE_DIR")
      {
      return replaceValues.ObjectFileDir;
      }
    }
  if(replaceValues.Objects)
    {
    if(variable == "OBJECTS")
      {
      return replaceValues.Objects;
      }
    }
  if(replaceValues.ObjectsQuoted)
    {
    if(variable == "OBJECTS_QUOTED")
      {
      return replaceValues.ObjectsQuoted;
      }
    }
  if(replaceValues.Defines && variable == "DEFINES")
    {
    return replaceValues.Defines;
    }
  if(replaceValues.TargetPDB )
    {
    if(variable == "TARGET_PDB")
      {
      return replaceValues.TargetPDB;
      }
    }
  if(replaceValues.TargetCompilePDB)
    {
    if(variable == "TARGET_COMPILE_PDB")
      {
      return replaceValues.TargetCompilePDB;
      }
    }
  if(replaceValues.DependencyFile )
    {
    if(variable == "DEP_FILE")
      {
      return replaceValues.DependencyFile;
      }
    }

  if(replaceValues.Target)
    {
    if(variable == "TARGET_QUOTED")
      {
      std::string targetQuoted = replaceValues.Target;
      if(!targetQuoted.empty() && targetQuoted[0] != '\"')
        {
        targetQuoted = '\"';
        targetQuoted += replaceValues.Target;
        targetQuoted += '\"';
        }
      return targetQuoted;
      }
    if(variable == "TARGET_UNQUOTED")
      {
      std::string unquoted = replaceValues.Target;
      std::string::size_type sz = unquoted.size();
      if(sz > 2 && unquoted[0] == '\"' && unquoted[sz-1] == '\"')
        {
        unquoted = unquoted.substr(1, sz-2);
        }
      return unquoted;
      }
    if(replaceValues.LanguageCompileFlags)
      {
      if(variable == "LANGUAGE_COMPILE_FLAGS")
        {
        return replaceValues.LanguageCompileFlags;
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET")
        {
        return replaceValues.Target;
        }
      }
    if(variable == "TARGET_IMPLIB")
      {
      return this->TargetImplib;
      }
    if(variable == "TARGET_VERSION_MAJOR")
      {
      if(replaceValues.TargetVersionMajor)
        {
        return replaceValues.TargetVersionMajor;
        }
      else
        {
        return "0";
        }
      }
    if(variable == "TARGET_VERSION_MINOR")
      {
      if(replaceValues.TargetVersionMinor)
        {
        return replaceValues.TargetVersionMinor;
        }
      else
        {
        return "0";
        }
      }
    if(replaceValues.Target)
      {
      if(variable == "TARGET_BASE")
        {
        // Strip the last extension off the target name.
        std::string targetBase = replaceValues.Target;
        std::string::size_type pos = targetBase.rfind(".");
        if(pos != targetBase.npos)
          {
        return targetBase.substr(0, pos);
          }
        else
          {
          return targetBase;
          }
        }
      }
    }
  if(variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
     variable == "TARGET_INSTALLNAME_DIR")
    {
    // All these variables depend on TargetSOName
    if(replaceValues.TargetSOName)
      {
      if(variable == "TARGET_SONAME")
        {
        return replaceValues.TargetSOName;
        }
      if(variable == "SONAME_FLAG" && replaceValues.SONameFlag)
        {
        return replaceValues.SONameFlag;
        }
      if(replaceValues.TargetInstallNameDir &&
         variable == "TARGET_INSTALLNAME_DIR")
        {
        return replaceValues.TargetInstallNameDir;
        }
      }
    return "";
    }
  if(replaceValues.LinkLibraries)
    {
    if(variable == "LINK_LIBRARIES")
      {
      return replaceValues.LinkLibraries;
      }
    }
  if(replaceValues.Language)
    {
    if(variable == "LANGUAGE")
      {
      return replaceValues.Language;
      }
    }
  if(replaceValues.CMTarget)
    {
    if(variable == "TARGET_NAME")
      {
      return replaceValues.CMTarget->GetName();
      }
    if(variable == "TARGET_TYPE")
      {
      return cmTarget::GetTargetTypeName(replaceValues.CMTarget->GetType());
      }
    }
  if(replaceValues.Output)
    {
    if(variable == "OUTPUT")
      {
      return replaceValues.Output;
      }
    }
  if(variable == "CMAKE_COMMAND")
    {
    return this->Convert(cmSystemTools::GetCMakeCommand(), FULL, SHELL);
    }
  std::vector<std::string> enabledLanguages =
      this->GetState()->GetEnabledLanguages();
  // loop over language specific replace variables
  int pos = 0;
  while(ruleReplaceVars[pos])
    {
    for(std::vector<std::string>::iterator i = enabledLanguages.begin();
        i != enabledLanguages.end(); ++i)
      {
      const char* lang = i->c_str();
      std::string actualReplace = ruleReplaceVars[pos];
      // If this is the compiler then look for the extra variable
      // _COMPILER_ARG1 which must be the first argument to the compiler
      const char* compilerArg1 = 0;
      const char* compilerTarget = 0;
      const char* compilerOptionTarget = 0;
      const char* compilerExternalToolchain = 0;
      const char* compilerOptionExternalToolchain = 0;
      const char* compilerSysroot = 0;
      const char* compilerOptionSysroot = 0;
      if(actualReplace == "CMAKE_${LANG}_COMPILER")
        {
        std::string arg1 = actualReplace + "_ARG1";
        cmSystemTools::ReplaceString(arg1, "${LANG}", lang);
        compilerArg1 = this->Makefile->GetDefinition(arg1);
        compilerTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang + "_COMPILER_TARGET");
        compilerOptionTarget
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                          "_COMPILE_OPTIONS_TARGET");
        compilerExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                                    "_COMPILER_EXTERNAL_TOOLCHAIN");
        compilerOptionExternalToolchain
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
        compilerSysroot
              = this->Makefile->GetDefinition("CMAKE_SYSROOT");
        compilerOptionSysroot
              = this->Makefile->GetDefinition(
                std::string("CMAKE_") + lang +
                              "_COMPILE_OPTIONS_SYSROOT");
        }
      if(actualReplace.find("${LANG}") != actualReplace.npos)
        {
        cmSystemTools::ReplaceString(actualReplace, "${LANG}", lang);
        }
      if(actualReplace == variable)
        {
        std::string replace =
          this->Makefile->GetSafeDefinition(variable);
        // if the variable is not a FLAG then treat it like a path
        if(variable.find("_FLAG") == variable.npos)
          {
          std::string ret = this->ConvertToOutputForExisting(replace);
          // if there is a required first argument to the compiler add it
          // to the compiler string
          if(compilerArg1)
            {
            ret += " ";
            ret += compilerArg1;
            }
          if (compilerTarget && compilerOptionTarget)
            {
            ret += " ";
            ret += compilerOptionTarget;
            ret += compilerTarget;
            }
          if (compilerExternalToolchain && compilerOptionExternalToolchain)
            {
            ret += " ";
            ret += compilerOptionExternalToolchain;
            ret += this->EscapeForShell(compilerExternalToolchain, true);
            }
          if (compilerSysroot && compilerOptionSysroot)
            {
            ret += " ";
            ret += compilerOptionSysroot;
            ret += this->EscapeForShell(compilerSysroot, true);
            }
          return ret;
          }
        return replace;
        }
      }
    pos++;
    }
  return variable;
}